

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

NumToEntryTable * __thiscall
google::protobuf::internal::anon_unknown_36::MakeNumToEntryTable
          (NumToEntryTable *__return_storage_ptr__,anon_unknown_36 *this,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  NumToEntryTable *pNVar4;
  uint uVar5;
  uint extraout_EAX;
  NumToEntryTable *in_RAX;
  NumToEntryTable *pNVar6;
  pointer pSVar7;
  Nonnull<const_char_*> failure_msg;
  anon_unknown_36 *paVar8;
  short sVar9;
  NumToEntryTable *unaff_RBP;
  pointer pFVar10;
  ulong uVar11;
  pointer pSVar12;
  SkipEntryBlock local_60;
  NumToEntryTable *local_40;
  pointer local_38;
  
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->skipmap32 = 0xffffffff;
  sVar9 = (short)ordered_fields.ptr_;
  if (sVar9 == 0) {
    return in_RAX;
  }
  pNVar6 = (NumToEntryTable *)0xffffffff;
  pFVar10 = (pointer)0x0;
  paVar8 = this;
  while( true ) {
    if (ordered_fields.ptr_ <= pFVar10) {
      _GLOBAL__N_1::MakeNumToEntryTable();
      goto LAB_00272855;
    }
    if (0x20 < *(int *)(*(long *)paVar8 + 4)) break;
    uVar5 = (int)pNVar6 + (-1 << ((char)*(int *)(*(long *)paVar8 + 4) - 1U & 0x1f));
    pNVar6 = (NumToEntryTable *)(ulong)uVar5;
    __return_storage_ptr__->skipmap32 = uVar5;
    pFVar10 = (pointer)((long)&pFVar10->field + 1);
    paVar8 = paVar8 + 0x20;
    if (sVar9 == (short)pFVar10) {
      return pNVar6;
    }
  }
  if (sVar9 == (short)pFVar10) {
    return pNVar6;
  }
  pSVar12 = (pointer)0x0;
  pNVar6 = (NumToEntryTable *)0x0;
  local_40 = __return_storage_ptr__;
  local_38 = ordered_fields.ptr_;
  bVar3 = true;
  while( true ) {
    pNVar4 = local_40;
    uVar5 = (uint)pNVar6;
    if (local_38 <= (pointer)((ulong)pFVar10 & 0xffff)) break;
    uVar1 = *(uint *)(*(long *)(this + (uint)((int)(pointer)((ulong)pFVar10 & 0xffff) << 5)) + 4);
    unaff_RBP = (NumToEntryTable *)(ulong)uVar1;
    if (uVar1 <= uVar5) goto LAB_0027285a;
    bVar2 = bVar3;
    if (0x60 < uVar1 - uVar5) {
      bVar2 = true;
    }
    if (bVar3) {
      bVar2 = bVar3;
    }
    if (bVar2) {
      local_60.entries.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.entries.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_60.entries.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60.first_fnum = uVar1;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
      ::emplace_back<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>
                (&__return_storage_ptr__->blocks,&local_60);
      if (local_60.entries.
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.entries.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.entries.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.entries.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pSVar12 = (pNVar4->blocks).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      bVar2 = false;
    }
    uVar5 = uVar1 - pSVar12->first_fnum;
    uVar11 = (ulong)(uVar5 >> 4);
    pSVar7 = (pSVar12->entries).
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pSVar12->entries).
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 2) <= uVar11) {
      do {
        local_60.first_fnum = CONCAT22((short)pFVar10,0xffff);
        std::
        vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ::emplace_back<google::protobuf::internal::TailCallTableInfo::SkipEntry16>
                  (&pSVar12->entries,(SkipEntry16 *)&local_60);
        pSVar7 = (pSVar12->entries).
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while ((ulong)((long)(pSVar12->entries).
                             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 2) <=
               uVar11);
    }
    uVar5 = uVar5 & 0xf;
    pSVar7[uVar11].skipmap = pSVar7[uVar11].skipmap + (short)(-1 << (sbyte)uVar5);
    pNVar6 = (NumToEntryTable *)(ulong)(uVar1 - uVar5);
    uVar5 = (int)pFVar10 + 1;
    pFVar10 = (pointer)(ulong)uVar5;
    unaff_RBP = pNVar6;
    bVar3 = bVar2;
    if ((short)uVar5 == (short)local_38) {
      return pNVar6;
    }
  }
LAB_00272855:
  _GLOBAL__N_1::MakeNumToEntryTable();
  uVar5 = extraout_EAX;
LAB_0027285a:
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)unaff_RBP,(ulong)uVar5,"fnum > last_skip_entry_start");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
             ,0x1e9,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

TailCallTableInfo::NumToEntryTable MakeNumToEntryTable(
    absl::Span<const TailCallTableInfo::FieldOptions> ordered_fields) {
  TailCallTableInfo::NumToEntryTable num_to_entry_table;
  num_to_entry_table.skipmap32 = static_cast<uint32_t>(-1);

  // skip_entry_block is the current block of SkipEntries that we're
  // appending to.  cur_block_first_fnum is the number of the first
  // field represented by the block.
  uint16_t field_entry_index = 0;
  uint16_t N = ordered_fields.size();
  // First, handle field numbers 1-32, which affect only the initial
  // skipmap32 and don't generate additional skip-entry blocks.
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    if (field_descriptor->number() > 32) break;
    auto skipmap32_index = field_descriptor->number() - 1;
    num_to_entry_table.skipmap32 -= 1 << skipmap32_index;
  }
  // If all the field numbers were less than or equal to 32, we will have
  // no further entries to process, and we are already done.
  if (field_entry_index == N) return num_to_entry_table;

  TailCallTableInfo::SkipEntryBlock* block = nullptr;
  bool start_new_block = true;
  // To determine sparseness, track the field number corresponding to
  // the start of the most recent skip entry.
  uint32_t last_skip_entry_start = 0;
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    uint32_t fnum = static_cast<uint32_t>(field_descriptor->number());
    ABSL_CHECK_GT(fnum, last_skip_entry_start);
    if (start_new_block == false) {
      // If the next field number is within 15 of the last_skip_entry_start, we
      // continue writing just to that entry.  If it's between 16 and 31 more,
      // then we just extend the current block by one. If it's more than 31
      // more, we have to add empty skip entries in order to continue using the
      // existing block.  Obviously it's just 32 more, it doesn't make sense to
      // start a whole new block, since new blocks mean having to write out
      // their starting field number, which is 32 bits, as well as the size of
      // the additional block, which is 16... while an empty SkipEntry16 only
      // costs 32 bits.  So if it was 48 more, it's a slight space win; we save
      // 16 bits, but probably at the cost of slower run time.  We're choosing
      // 96 for now.
      if (fnum - last_skip_entry_start > 96) start_new_block = true;
    }
    if (start_new_block) {
      num_to_entry_table.blocks.push_back({fnum});
      block = &num_to_entry_table.blocks.back();
      start_new_block = false;
    }

    auto skip_entry_num = (fnum - block->first_fnum) / 16;
    auto skip_entry_index = (fnum - block->first_fnum) % 16;
    while (skip_entry_num >= block->entries.size())
      block->entries.push_back({0xFFFF, field_entry_index});
    block->entries[skip_entry_num].skipmap -= 1 << (skip_entry_index);

    last_skip_entry_start = fnum - skip_entry_index;
  }
  return num_to_entry_table;
}